

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O3

bool __thiscall ShParser::decodeOpcode(ShParser *this,Parser *parser,tShOpcode *opcode)

{
  long lVar1;
  Token *pTVar2;
  ulong uVar3;
  char cVar4;
  char *pcVar5;
  bool bVar6;
  string name;
  long *local_40;
  ulong local_38;
  long local_30 [2];
  
  pcVar5 = opcode->name;
  (this->registers).grt.num = -1;
  (this->registers).grs.num = -1;
  ShImmediateData::reset(&this->immediate);
  pTVar2 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  if (pTVar2->type == Identifier) {
    if (*(__index_type *)
         ((long)&(pTVar2->value).
                 super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                 super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
         + 0x20) != '\x04') {
LAB_0016ede7:
      __assert_fail("std::holds_alternative<Identifier>(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                    ,0x4d,"const Identifier &Token::identifierValue() const");
    }
    lVar1 = *(long *)&(pTVar2->value).
                      super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                      super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      .
                      super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      ._M_u;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,lVar1,
               *(long *)((long)&(pTVar2->value).
                                super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        + 8) + lVar1);
    cVar4 = *pcVar5;
    if (cVar4 == '\0') {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      do {
        pcVar5 = pcVar5 + 1;
        if (cVar4 == '/') {
          if (((uVar3 < local_38) ||
              (pTVar2 = Tokenizer::nextToken
                                  ((parser->entries).
                                   super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer),
              pTVar2->type != Div)) ||
             (pTVar2 = Tokenizer::peekToken
                                 ((parser->entries).
                                  super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0),
             pTVar2->type != Identifier)) goto LAB_0016edb4;
          pTVar2 = Tokenizer::nextToken
                             ((parser->entries).
                              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
          if (*(__index_type *)
               ((long)&(pTVar2->value).
                       super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                       super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
               + 0x20) != '\x04') goto LAB_0016ede7;
          std::__cxx11::string::_M_assign((string *)&local_40);
          uVar3 = 0;
        }
        else {
          if ((local_38 <= uVar3) || (cVar4 != *(char *)((long)local_40 + uVar3))) {
LAB_0016edb4:
            bVar6 = false;
            goto LAB_0016edc2;
          }
          uVar3 = uVar3 + 1;
        }
        cVar4 = *pcVar5;
      } while (cVar4 != '\0');
    }
    bVar6 = local_38 <= uVar3;
LAB_0016edc2:
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ShParser::decodeOpcode(Parser& parser, const tShOpcode& opcode)
{
	const char* encoding = opcode.name;
	size_t pos = 0;

	registers.reset();
	immediate.reset();
	opcodeData.reset();

	const Token &token = parser.nextToken();
	if (token.type != TokenType::Identifier)
		return false;
		
	const Identifier &identifier = token.identifierValue();
	std::string name = identifier.string();

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case '/':
			CHECK(pos >= name.size());
			CHECK(parser.nextToken().type == TokenType::Div);
			CHECK(parser.peekToken().type == TokenType::Identifier);
			
			name = parser.nextToken().identifierValue().string();
			pos = 0;
			break;
		default:
			CHECK(pos < name.size());
			CHECK(*(encoding-1) == name[pos++]);
			break;
		}
	}

	return pos >= name.size();
}